

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_format_filter_by_ext.c
# Opt level: O3

void test_format_filter_by_ext
               (char *output_file,int format_id,int filter_id,int dot_stored,char *def_ext)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  uint uVar5;
  void *buff;
  archive *paVar6;
  char *pcVar7;
  archive_entry *entry;
  time_t tVar8;
  la_ssize_t v2;
  la_int64_t v2_00;
  char *e1;
  char *v1;
  longlong v2_01;
  ulong v1_00;
  archive_entry *ae;
  size_t used;
  archive_entry *local_48;
  uint local_40;
  uint local_3c;
  size_t local_38;
  
  buff = malloc(0x100000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'(',(uint)(buff != (void *)0x0),"(buff = malloc(buffsize)) != NULL",(void *)0x0
                  );
  if (buff == (void *)0x0) {
    return;
  }
  local_3c = filter_id;
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'-',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  if (def_ext == (char *)0x0) {
    iVar1 = archive_write_set_format_filter_by_ext(paVar6,output_file);
  }
  else {
    iVar1 = archive_write_set_format_filter_by_ext_def(paVar6,output_file,def_ext);
  }
  if (iVar1 == -0x1e) {
    pcVar7 = archive_error_string(paVar6);
    iVar2 = strcmp(pcVar7,"lzma compression not supported on this platform");
    if (iVar2 != 0) {
      pcVar7 = archive_error_string(paVar6);
      iVar2 = strcmp(pcVar7,"xz compression not supported on this platform");
      if (iVar2 != 0) goto LAB_00132d66;
    }
    pcVar7 = archive_filter_name(paVar6,0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'>');
    test_skipping("%s filter not supported on this platform",pcVar7);
    iVar1 = archive_write_free(paVar6);
    v2_01 = (longlong)iVar1;
    wVar3 = L'?';
  }
  else {
    if (iVar1 == -0x14) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                     ,L'3');
      pcVar7 = archive_format_name(paVar6);
      test_skipping("%s format not fully supported on this platform",pcVar7);
      iVar1 = archive_write_free(paVar6);
      v2_01 = (longlong)iVar1;
      wVar3 = L'5';
      goto LAB_001332bf;
    }
LAB_00132d66:
    wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                                ,L'C',0,"ARCHIVE_OK",(long)iVar1,"r",paVar6);
    if (wVar3 != L'\0') {
      local_40 = format_id;
      iVar1 = archive_write_open_memory(paVar6,buff,0x100000,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'K',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used)",paVar6);
      entry = archive_entry_new();
      local_48 = entry;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                       ,L'P',(uint)(entry != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_mtime(entry,1,0);
      tVar8 = archive_entry_mtime(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'R',1,"1",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
      archive_entry_set_ctime(entry,1,0);
      tVar8 = archive_entry_ctime(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'T',1,"1",tVar8,"archive_entry_ctime(ae)",(void *)0x0);
      archive_entry_set_atime(entry,1,0);
      tVar8 = archive_entry_atime(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'V',1,"1",tVar8,"archive_entry_atime(ae)",(void *)0x0);
      archive_entry_copy_pathname(entry,"file");
      pcVar7 = archive_entry_pathname(entry);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                 ,L'X',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      archive_entry_set_mode(entry,0x81ed);
      mVar4 = archive_entry_mode(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'Z',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar4,"archive_entry_mode(ae)",
                          (void *)0x0);
      archive_entry_set_size(entry,8);
      iVar1 = archive_write_header(paVar6,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\\',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
      archive_entry_free(entry);
      v2 = archive_write_data(paVar6,"12345678",8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'^',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
      iVar1 = archive_write_close(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar6);
      iVar1 = archive_write_free(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar6 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                       ,L'i',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar6);
      iVar1 = archive_read_support_filter_all(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar6);
      iVar1 = read_open_memory_seek(paVar6,buff,local_38,7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'o',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)"
                          ,paVar6);
      if ((dot_stored & 1U) != 0) {
        iVar1 = archive_read_next_header(paVar6,&local_48);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                            paVar6);
        pcVar7 = archive_entry_pathname(local_48);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L't',".","\".\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar4 = archive_entry_filetype(local_48);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'u',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
      }
      iVar1 = archive_read_next_header(paVar6,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar6
                         );
      tVar8 = archive_entry_mtime(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'{',1,"1",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar7 = archive_entry_pathname(local_48);
      uVar5 = local_3c;
      if ((dot_stored & 2U) == 0) {
        v1 = "file";
        e1 = "\"file\"";
        wVar3 = L'\x7f';
      }
      else {
        v1 = "./file";
        e1 = "\"./file\"";
        wVar3 = L'}';
      }
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                 ,wVar3,v1,e1,pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar4 = archive_entry_filetype(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x81',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      v2_00 = archive_entry_size(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x82',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar6,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x85',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar6);
      iVar1 = archive_filter_code(paVar6,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x89',(ulong)uVar5,"filter_id",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar6);
      v1_00 = (ulong)local_40;
      uVar5 = archive_format(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x8a',v1_00,"format_id",(ulong)(uVar5 & 0xff0000),
                          "archive_format(a) & ARCHIVE_FORMAT_BASE_MASK",paVar6);
      iVar1 = archive_read_close(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x8c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      free(buff);
      return;
    }
    iVar1 = archive_write_free(paVar6);
    v2_01 = (longlong)iVar1;
    wVar3 = L'D';
  }
LAB_001332bf:
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                      ,wVar3,0,"ARCHIVE_OK",v2_01,"archive_write_free(a)",(void *)0x0);
  free(buff);
  return;
}

Assistant:

static void
test_format_filter_by_ext(const char *output_file, 
    int format_id, int filter_id, int dot_stored, const char * def_ext)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 1024;
	char *buff;
	int r;

	assert((buff = malloc(buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	if( def_ext == NULL)
          r = archive_write_set_format_filter_by_ext(a, output_file);
        else
          r = archive_write_set_format_filter_by_ext_def(a, output_file, def_ext);
	if (r == ARCHIVE_WARN) {
		skipping("%s format not fully supported on this platform",
		   archive_format_name(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
        } else if (r == ARCHIVE_FATAL &&
	    (strcmp(archive_error_string(a),
		   "lzma compression not supported on this platform") == 0 ||
	     strcmp(archive_error_string(a),
		   "xz compression not supported on this platform") == 0)) {
                const char *filter_name = archive_filter_name(a, 0);
		skipping("%s filter not supported on this platform", filter_name);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	} else {
		if (!assertEqualIntA(a, ARCHIVE_OK, r)) {
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	}
        
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (format_id > 0) {
		/*
		 * Now, read the data back.
		 */
		/* With the test memory reader -- seeking mode. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    read_open_memory_seek(a, buff, used, 7));

		if (dot_stored & 1) {
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			assertEqualString(".", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
		}
		/*
		 * Read and verify the file.
		 */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(1, archive_entry_mtime(ae));
		if (dot_stored & 2) {
			assertEqualString("./file", archive_entry_pathname(ae));
		} else {
			assertEqualString("file", archive_entry_pathname(ae));
		}
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(8, archive_entry_size(ae));

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, filter_id,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, format_id, archive_format(a) & ARCHIVE_FORMAT_BASE_MASK );

		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff);
}